

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O1

void __thiscall QHttpThreadDelegate::encryptedSlot(QHttpThreadDelegate *this)

{
  long in_FS_OFFSET;
  QHttpNetworkReply local_40 [8];
  void *local_38;
  QHttpNetworkReply *pQStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x150) != 0) {
    QHttpNetworkReply::sslConfiguration(local_40);
    local_38 = (void *)0x0;
    pQStack_30 = local_40;
    QMetaObject::activate((QObject *)this,&staticMetaObject,4,&local_38);
    QSslConfiguration::~QSslConfiguration((QSslConfiguration *)local_40);
    QMetaObject::activate((QObject *)this,&staticMetaObject,2,(void **)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::encryptedSlot()
{
    if (!httpReply)
        return;

    emit sslConfigurationChanged(httpReply->sslConfiguration());
    emit encrypted();
}